

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::InitializeWithPolicy
          (ThreadSafeArena *this,void *mem,size_t size,AllocationPolicy policy)

{
  bool bVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  uintptr_t uVar4;
  bool local_1e1;
  LogFinisher local_1a2;
  byte local_1a1;
  LogMessage local_1a0;
  LogFinisher local_162;
  byte local_161;
  LogMessage local_160;
  LogFinisher local_121;
  LogMessage local_120;
  AllocationPolicy *local_e8;
  void *p;
  __pointer_type sa;
  Memory tmp;
  size_t kMinimumSize;
  size_t kAPSize;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  uintptr_t local_28;
  uint64_t old_alloc_policy;
  size_t size_local;
  void *mem_local;
  ThreadSafeArena *this_local;
  
  old_alloc_policy = size;
  size_local = (size_t)mem;
  mem_local = this;
  local_28 = TaggedAllocationPolicyPtr::get_raw((TaggedAllocationPolicyPtr *)(this + 8));
  bVar1 = AllocationPolicy::IsDefault(&policy);
  if (bVar1) {
    InitializeFrom(this,(void *)size_local,old_alloc_policy);
    if (3 < local_28) {
      uVar3 = local_28 & 3;
      uVar4 = TaggedAllocationPolicyPtr::get_raw((TaggedAllocationPolicyPtr *)(this + 8));
      local_61 = 0;
      if (uVar3 != (uVar4 & 3)) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                   ,0xf6);
        local_61 = 1;
        pLVar2 = LogMessage::operator<<
                           (&local_60,
                            "CHECK failed: (old_alloc_policy & 3) == (alloc_policy_.get_raw() & 3): "
                           );
        LogFinisher::operator=(local_75,pLVar2);
      }
      if ((local_61 & 1) != 0) {
        LogMessage::~LogMessage(&local_60);
      }
    }
  }
  else {
    kAPSize._7_1_ = 0;
    if ((size_local & 7) != 0) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0xf9);
      kAPSize._7_1_ = 1;
      pLVar2 = LogMessage::operator<<
                         (&local_b0,"CHECK failed: (reinterpret_cast<uintptr_t>(mem) & 7) == (0u): "
                         );
      LogFinisher::operator=((LogFinisher *)((long)&kAPSize + 6),pLVar2);
    }
    if ((kAPSize._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_b0);
    }
    Init(this);
    tmp.size = 0x78;
    local_1e1 = false;
    if (policy.metrics_collector != (ArenaMetricsCollector *)0x0) {
      local_1e1 = ArenaMetricsCollector::RecordAllocs(policy.metrics_collector);
    }
    TaggedAllocationPolicyPtr::set_should_record_allocs
              ((TaggedAllocationPolicyPtr *)(this + 8),local_1e1);
    if ((size_local == 0) || (old_alloc_policy < 0x78)) {
      _sa = AllocateMemory(&policy,0,0x78);
      size_local = (size_t)sa;
      old_alloc_policy = (uint64_t)tmp.ptr;
    }
    else {
      TaggedAllocationPolicyPtr::set_is_user_owned_initial_block
                ((TaggedAllocationPolicyPtr *)(this + 8),true);
    }
    SetInitialBlock(this,(void *)size_local,old_alloc_policy);
    p = std::atomic<google::protobuf::internal::SerialArena_*>::load
                  ((atomic<google::protobuf::internal::SerialArena_*> *)(this + 0x10),
                   memory_order_relaxed);
    if (((__pointer_type)p == (__pointer_type)0x0) ||
       (bVar1 = SerialArena::MaybeAllocateAligned((SerialArena *)p,0x28,&local_e8), !bVar1)) {
      LogMessage::LogMessage
                (&local_120,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0x115);
      pLVar2 = LogMessage::operator<<(&local_120,"MaybeAllocateAligned cannot fail here.");
      LogFinisher::operator=(&local_121,pLVar2);
      LogMessage::~LogMessage(&local_120);
    }
    else {
      memcpy(local_e8,&policy,0x28);
      local_161 = 0;
      if (((ulong)local_e8 & 3) != 0) {
        LogMessage::LogMessage
                  (&local_160,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                   ,0x11a);
        local_161 = 1;
        pLVar2 = LogMessage::operator<<
                           (&local_160,"CHECK failed: (0) == (reinterpret_cast<uintptr_t>(p) & 3): "
                           );
        LogFinisher::operator=(&local_162,pLVar2);
      }
      if ((local_161 & 1) != 0) {
        LogMessage::~LogMessage(&local_160);
      }
      TaggedAllocationPolicyPtr::set_policy((TaggedAllocationPolicyPtr *)(this + 8),local_e8);
      if (3 < local_28) {
        uVar3 = local_28 & 3;
        uVar4 = TaggedAllocationPolicyPtr::get_raw((TaggedAllocationPolicyPtr *)(this + 8));
        local_1a1 = 0;
        if (uVar3 != (uVar4 & 3)) {
          LogMessage::LogMessage
                    (&local_1a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                     ,0x11c);
          local_1a1 = 1;
          pLVar2 = LogMessage::operator<<
                             (&local_1a0,
                              "CHECK failed: (old_alloc_policy & 3) == (alloc_policy_.get_raw() & 3): "
                             );
          LogFinisher::operator=(&local_1a2,pLVar2);
        }
        if ((local_1a1 & 1) != 0) {
          LogMessage::~LogMessage(&local_1a0);
        }
      }
    }
  }
  return;
}

Assistant:

void ThreadSafeArena::InitializeWithPolicy(void* mem, size_t size,
                                           AllocationPolicy policy) {
#ifndef NDEBUG
  const uint64_t old_alloc_policy = alloc_policy_.get_raw();
  // If there was a policy (e.g., in Reset()), make sure flags were preserved.
#define GOOGLE_DCHECK_POLICY_FLAGS_() \
  if (old_alloc_policy > 3)    \
    GOOGLE_CHECK_EQ(old_alloc_policy & 3, alloc_policy_.get_raw() & 3)
#else
#define GOOGLE_DCHECK_POLICY_FLAGS_()
#endif  // NDEBUG

  if (policy.IsDefault()) {
    // Legacy code doesn't use the API above, but provides the initial block
    // through ArenaOptions. I suspect most do not touch the allocation
    // policy parameters.
    InitializeFrom(mem, size);
    GOOGLE_DCHECK_POLICY_FLAGS_();
    return;
  }
  GOOGLE_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) & 7, 0u);
  Init();

  // Ignore initial block if it is too small. We include an optional
  // AllocationPolicy in this check, so that this can be allocated on the
  // first block.
  constexpr size_t kAPSize = internal::AlignUpTo8(sizeof(AllocationPolicy));
  constexpr size_t kMinimumSize = kBlockHeaderSize + kSerialArenaSize + kAPSize;

  // The value for alloc_policy_ stores whether or not allocations should be
  // recorded.
  alloc_policy_.set_should_record_allocs(
      policy.metrics_collector != nullptr &&
      policy.metrics_collector->RecordAllocs());
  // Make sure we have an initial block to store the AllocationPolicy.
  if (mem != nullptr && size >= kMinimumSize) {
    alloc_policy_.set_is_user_owned_initial_block(true);
  } else {
    auto tmp = AllocateMemory(&policy, 0, kMinimumSize);
    mem = tmp.ptr;
    size = tmp.size;
  }
  SetInitialBlock(mem, size);

  auto sa = threads_.load(std::memory_order_relaxed);
  // We ensured enough space so this cannot fail.
  void* p;
  if (!sa || !sa->MaybeAllocateAligned(kAPSize, &p)) {
    GOOGLE_LOG(FATAL) << "MaybeAllocateAligned cannot fail here.";
    return;
  }
  new (p) AllocationPolicy{policy};
  // Low bits store flags, so they mustn't be overwritten.
  GOOGLE_DCHECK_EQ(0, reinterpret_cast<uintptr_t>(p) & 3);
  alloc_policy_.set_policy(reinterpret_cast<AllocationPolicy*>(p));
  GOOGLE_DCHECK_POLICY_FLAGS_();

#undef GOOGLE_DCHECK_POLICY_FLAGS_
}